

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * next_option(char *list,vec *val,vec *eq_val)

{
  size_t __n;
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  
  if (val == (vec *)0x0) {
LAB_00117482:
    list = (char *)0x0;
  }
  else {
    do {
      if ((list == (char *)0x0) || (cVar1 = *list, pcVar5 = list, cVar1 == '\0')) goto LAB_00117482;
      while ((cVar1 == ' ' || (cVar1 == '\t'))) {
        list = list + 1;
        cVar1 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      }
      val->ptr = pcVar5;
      pcVar2 = strchr(pcVar5,0x2c);
      if (pcVar2 == (char *)0x0) {
        uVar3 = strlen(pcVar5);
        list = pcVar5 + uVar3;
        val->len = uVar3;
      }
      else {
        uVar3 = (long)pcVar2 - (long)list;
        val->len = uVar3;
        list = pcVar2 + 1;
      }
      sVar4 = (size_t)(int)uVar3;
      for (uVar3 = uVar3 & 0xffffffff; 0 < (int)(uint)uVar3; uVar3 = uVar3 - 1) {
        if ((pcVar5[uVar3 - 1] != ' ') && (pcVar5[uVar3 - 1] != '\t')) {
          val->len = (ulong)((uint)uVar3 & 0x7fffffff);
          goto LAB_0011743b;
        }
        sVar4 = sVar4 - 1;
      }
      val->len = sVar4;
    } while (uVar3 == 0);
LAB_0011743b:
    if (eq_val != (vec *)0x0) {
      eq_val->len = 0;
      __n = val->len;
      pcVar5 = (char *)memchr(pcVar5,0x3d,__n);
      eq_val->ptr = pcVar5;
      if (pcVar5 != (char *)0x0) {
        eq_val->ptr = pcVar5 + 1;
        pcVar2 = val->ptr;
        eq_val->len = (size_t)(pcVar2 + (__n - (long)(pcVar5 + 1)));
        val->len = (size_t)(pcVar5 + ~(ulong)pcVar2 + 1);
      }
    }
  }
  return list;
}

Assistant:

static const char *
next_option(const char *list, struct vec *val, struct vec *eq_val)
{
	int end;

reparse:
	if (val == NULL || list == NULL || *list == '\0') {
		/* End of the list */
		return NULL;
	}

	/* Skip over leading LWS */
	while (*list == ' ' || *list == '\t')
		list++;

	val->ptr = list;
	if ((list = strchr(val->ptr, ',')) != NULL) {
		/* Comma found. Store length and shift the list ptr */
		val->len = ((size_t)(list - val->ptr));
		list++;
	} else {
		/* This value is the last one */
		list = val->ptr + strlen(val->ptr);
		val->len = ((size_t)(list - val->ptr));
	}

	/* Adjust length for trailing LWS */
	end = (int)val->len - 1;
	while (end >= 0 && ((val->ptr[end] == ' ') || (val->ptr[end] == '\t')))
		end--;
	val->len = (size_t)(end) + (size_t)(1);

	if (val->len == 0) {
		/* Ignore any empty entries. */
		goto reparse;
	}

	if (eq_val != NULL) {
		/* Value has form "x=y", adjust pointers and lengths
		 * so that val points to "x", and eq_val points to "y". */
		eq_val->len = 0;
		eq_val->ptr = (const char *)memchr(val->ptr, '=', val->len);
		if (eq_val->ptr != NULL) {
			eq_val->ptr++; /* Skip over '=' character */
			eq_val->len = ((size_t)(val->ptr - eq_val->ptr)) + val->len;
			val->len = ((size_t)(eq_val->ptr - val->ptr)) - 1;
		}
	}

	return list;
}